

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderTessellationInputPatchDiscard::
TessellationShaderTessellationInputPatchDiscard
          (TessellationShaderTessellationInputPatchDiscard *this,Context *context,
          ExtParameters *extParams)

{
  TestCaseBase::TestCaseBase
            (&this->super_TestCaseBase,context,extParams,"input_patch_discard",
             "Verifies that patches, for which relevant outer tessellation levels have been defined to 0 or less, are discard by the tessellation primitive  generator."
            );
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderTessellationInputPatchDiscard_02108768;
  this->m_bo_id = 0;
  this->m_fs_id = 0;
  this->m_vs_id = 0;
  this->m_vao_id = 0;
  (this->m_runs).
  super__Vector_base<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_runs).
  super__Vector_base<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_runs).
  super__Vector_base<glcts::TessellationShaderTessellationInputPatchDiscard::_run,_std::allocator<glcts::TessellationShaderTessellationInputPatchDiscard::_run>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_utils_ptr = (TessellationShaderUtils *)0x0;
  return;
}

Assistant:

TessellationShaderTessellationInputPatchDiscard::TessellationShaderTessellationInputPatchDiscard(
	Context& context, const ExtParameters& extParams)
	: TestCaseBase(context, extParams, "input_patch_discard",
				   "Verifies that patches, for which relevant outer tessellation levels have"
				   " been defined to 0 or less, are discard by the tessellation primitive "
				   " generator.")
	, m_bo_id(0)
	, m_fs_id(0)
	, m_vs_id(0)
	, m_vao_id(0)
	, m_utils_ptr(0)
{
	/* Left blank on purpose */
}